

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event::DeepCopy(Event *this)

{
  DataPiece *this_00;
  Type TVar1;
  pointer pcVar2;
  size_t size;
  StringPiece local_70;
  undefined1 local_60 [24];
  _Alloc_hider local_48;
  char local_38 [16];
  
  this_00 = &this->value_;
  TVar1 = (this->value_).type_;
  if (TVar1 == TYPE_BYTES) {
    DataPiece::ToBytes_abi_cxx11_
              ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_70,this_00);
    if ((Code)local_70.ptr_ != OK) {
      internal::StatusOrHelper::Crash((Status *)&local_70);
    }
    std::__cxx11::string::_M_assign((string *)&this->value_storage_);
    if (local_48._M_p != local_38) {
      operator_delete(local_48._M_p);
    }
    if ((undefined1 *)local_70.length_ != local_60 + 8) {
      operator_delete((void *)local_70.length_);
    }
    pcVar2 = (this->value_storage_)._M_dataplus._M_p;
    size = (this->value_storage_)._M_string_length;
    if ((long)size < 0) {
      StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
    }
    local_60[0x10] = (this->value_).use_strict_base64_decoding_;
    local_70.length_._0_4_ = 10;
    local_70.ptr_ = (char *)&PTR__DataPiece_003c8cd8;
  }
  else {
    if (TVar1 != TYPE_STRING) {
      return;
    }
    local_70 = DataPiece::str(this_00);
    StrAppend(&this->value_storage_,(AlphaNum *)&local_70);
    pcVar2 = (this->value_storage_)._M_dataplus._M_p;
    size = (this->value_storage_)._M_string_length;
    if ((long)size < 0) {
      StringPiece::LogFatalSizeTooBig(size,"size_t to int conversion");
    }
    local_60[0x10] = (this->value_).use_strict_base64_decoding_;
    local_70.length_._0_4_ = 9;
    local_70.ptr_ = (char *)&PTR__DataPiece_003c8cd8;
  }
  local_60._0_8_ = pcVar2;
  local_60._8_8_ = size;
  DataPiece::InternalCopy(this_00,(DataPiece *)&local_70);
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::Event::DeepCopy() {
  // DataPiece only contains a string reference. To make sure the referenced
  // string value stays valid, we make a copy of the string value and update
  // DataPiece to reference our own copy.
  if (value_.type() == DataPiece::TYPE_STRING) {
    StrAppend(&value_storage_, value_.str());
    value_ = DataPiece(value_storage_, value_.use_strict_base64_decoding());
  } else if (value_.type() == DataPiece::TYPE_BYTES) {
    value_storage_ = value_.ToBytes().ValueOrDie();
    value_ =
        DataPiece(value_storage_, true, value_.use_strict_base64_decoding());
  }
}